

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

float rsg::AssignOp::getWeight(GeneratorState *state,ConstValueRangeAccess valueRange)

{
  IsWritableIntersectingEntry filter;
  GeneratorState *state_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  VariableType *pVVar4;
  VariableManager *pVVar5;
  ShaderParameters *pSVar6;
  IsWritableIntersectingEntry local_30;
  GeneratorState *local_18;
  GeneratorState *state_local;
  
  local_18 = state;
  pVVar4 = ConstValueRangeAccess::getType(&valueRange);
  bVar1 = VariableType::isVoid(pVVar4);
  state_00 = local_18;
  if (!bVar1) {
    pVVar4 = ConstValueRangeAccess::getType(&valueRange);
    bVar1 = anon_unknown_0::canAllocateVariable(state_00,pVVar4);
    if (!bVar1) {
      pVVar5 = GeneratorState::getVariableManager(local_18);
      anon_unknown_0::IsWritableIntersectingEntry::IsWritableIntersectingEntry(&local_30,valueRange)
      ;
      filter.m_valueRange.m_min = local_30.m_valueRange.m_min;
      filter.m_valueRange.m_type = local_30.m_valueRange.m_type;
      filter.m_valueRange.m_max = local_30.m_valueRange.m_max;
      bVar1 = VariableManager::hasEntry<rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
                        (pVVar5,filter);
      if (!bVar1) {
        return 0.0;
      }
    }
  }
  pVVar4 = ConstValueRangeAccess::getType(&valueRange);
  bVar1 = VariableType::isVoid(pVVar4);
  if (!bVar1) {
    iVar2 = GeneratorState::getExpressionDepth(local_18);
    pVVar4 = ConstValueRangeAccess::getType(&valueRange);
    iVar3 = getTypeConstructorDepth(pVVar4);
    pSVar6 = GeneratorState::getShaderParameters(local_18);
    if (pSVar6->maxExpressionDepth <= iVar2 + iVar3 + 1) {
      return 0.0;
    }
  }
  pVVar4 = ConstValueRangeAccess::getType(&valueRange);
  bVar1 = VariableType::isVoid(pVVar4);
  if (bVar1) {
    pVVar5 = GeneratorState::getVariableManager(local_18);
    bVar1 = VariableManager::hasEntry<rsg::IsWritableEntry>(pVVar5);
    if (!bVar1) {
      pVVar5 = GeneratorState::getVariableManager(local_18);
      iVar2 = VariableManager::getNumAllocatedScalars(pVVar5);
      pSVar6 = GeneratorState::getShaderParameters(local_18);
      if (pSVar6->maxCombinedVariableScalars <= iVar2) {
        return 0.0;
      }
    }
  }
  iVar2 = GeneratorState::getExpressionDepth(local_18);
  if (iVar2 == 0) {
    state_local._4_4_ = 4.0;
  }
  else {
    state_local._4_4_ = 0.0;
  }
  return state_local._4_4_;
}

Assistant:

float AssignOp::getWeight (const GeneratorState& state, ConstValueRangeAccess valueRange)
{
	if (!valueRange.getType().isVoid() &&
		!canAllocateVariable(state, valueRange.getType()) &&
		!state.getVariableManager().hasEntry(IsWritableIntersectingEntry(valueRange)))
		return 0.0f; // Would require creating a new variable

	if (!valueRange.getType().isVoid() && state.getExpressionDepth() + getTypeConstructorDepth(valueRange.getType()) + 1 >= state.getShaderParameters().maxExpressionDepth)
		return 0.0f;

	if (valueRange.getType().isVoid() &&
		!state.getVariableManager().hasEntry<IsWritableEntry>() &&
		state.getVariableManager().getNumAllocatedScalars() >= state.getShaderParameters().maxCombinedVariableScalars)
		return 0.0f; // Can not allocate a new entry

	if (state.getExpressionDepth() == 0)
		return 4.0f;
	else
		return 0.0f; // \todo [pyry] Fix assign ops
}